

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::ChValueSpecific<unsigned_long>::CallOut
          (ChValueSpecific<unsigned_long> *this,ChArchiveOut *marchive)

{
  (*(marchive->super_ChArchive)._vptr_ChArchive[9])(marchive);
  return;
}

Assistant:

void ChValueSpecific<TClass>::CallOut(ChArchiveOut& marchive) {
          marchive.out(CHNVP(*this->_ptr_to_val,this->_name.c_str()));
}